

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O1

void __thiscall
Assimp::COBImporter::ReadAsciiFile(COBImporter *this,Scene *out,StreamReaderLE *stream)

{
  Scene *pSVar1;
  LineSplitter *this_00;
  LineSplitter splitter;
  ChunkInfo ci;
  LineSplitter local_78;
  _Map_pointer local_40;
  uint uStack_38;
  
  this_00 = &local_78;
  local_40 = (_Map_pointer)0x0;
  _uStack_38 = 0xffffffff00000000;
  local_78.mIdx = 0;
  local_78.mCur._M_dataplus._M_p = (pointer)&local_78.mCur.field_2;
  local_78.mCur._M_string_length = 0;
  local_78.mCur.field_2._M_local_buf[0] = '\0';
  local_78.mSwallow = false;
  local_78.mSkip_empty_lines = true;
  local_78.mTrim = true;
  local_78.mStream = stream;
  std::__cxx11::string::reserve((ulong)&local_78.mCur);
  LineSplitter::operator++(&local_78);
  local_78.mIdx = 0;
  while (*(int *)&(local_78.mStream)->end != *(int *)&(local_78.mStream)->current) {
    if ((4 < local_78.mCur._M_string_length) &&
       ((char)*(int *)(local_78.mCur._M_dataplus._M_p + 4) == ' ' &&
        *(int *)local_78.mCur._M_dataplus._M_p == 0x486c6f50)) {
      ReadChunkInfo_Ascii((COBImporter *)this_00,(ChunkInfo *)&stack0xffffffffffffffc0,&local_78);
      this_00 = (LineSplitter *)this;
      ReadPolH_Ascii(this,out,&local_78,(ChunkInfo *)&stack0xffffffffffffffc0);
    }
    if ((4 < local_78.mCur._M_string_length) &&
       ((char)*(int *)(local_78.mCur._M_dataplus._M_p + 4) == ' ' &&
        *(int *)local_78.mCur._M_dataplus._M_p == 0x4d746942)) {
      pSVar1 = (Scene *)&stack0xffffffffffffffc0;
      ReadChunkInfo_Ascii((COBImporter *)this_00,(ChunkInfo *)&stack0xffffffffffffffc0,&local_78);
      this_00 = (LineSplitter *)this;
      ReadBitM_Ascii(this,pSVar1,&local_78,(ChunkInfo *)&stack0xffffffffffffffc0);
    }
    if ((4 < local_78.mCur._M_string_length) &&
       ((char)*(int *)(local_78.mCur._M_dataplus._M_p + 4) == ' ' &&
        *(int *)local_78.mCur._M_dataplus._M_p == 0x3174614d)) {
      ReadChunkInfo_Ascii((COBImporter *)this_00,(ChunkInfo *)&stack0xffffffffffffffc0,&local_78);
      this_00 = (LineSplitter *)this;
      ReadMat1_Ascii(this,out,&local_78,(ChunkInfo *)&stack0xffffffffffffffc0);
    }
    if ((4 < local_78.mCur._M_string_length) &&
       ((char)*(int *)(local_78.mCur._M_dataplus._M_p + 4) == ' ' &&
        *(int *)local_78.mCur._M_dataplus._M_p == 0x756f7247)) {
      ReadChunkInfo_Ascii((COBImporter *)this_00,(ChunkInfo *)&stack0xffffffffffffffc0,&local_78);
      this_00 = (LineSplitter *)this;
      ReadGrou_Ascii(this,out,&local_78,(ChunkInfo *)&stack0xffffffffffffffc0);
    }
    if ((4 < local_78.mCur._M_string_length) &&
       ((char)*(int *)(local_78.mCur._M_dataplus._M_p + 4) == ' ' &&
        *(int *)local_78.mCur._M_dataplus._M_p == 0x7468674c)) {
      ReadChunkInfo_Ascii((COBImporter *)this_00,(ChunkInfo *)&stack0xffffffffffffffc0,&local_78);
      this_00 = (LineSplitter *)this;
      ReadLght_Ascii(this,out,&local_78,(ChunkInfo *)&stack0xffffffffffffffc0);
    }
    if ((4 < local_78.mCur._M_string_length) &&
       ((char)*(int *)(local_78.mCur._M_dataplus._M_p + 4) == ' ' &&
        *(int *)local_78.mCur._M_dataplus._M_p == 0x656d6143)) {
      ReadChunkInfo_Ascii((COBImporter *)this_00,(ChunkInfo *)&stack0xffffffffffffffc0,&local_78);
      this_00 = (LineSplitter *)this;
      ReadCame_Ascii(this,out,&local_78,(ChunkInfo *)&stack0xffffffffffffffc0);
    }
    if ((4 < local_78.mCur._M_string_length) &&
       ((char)*(int *)(local_78.mCur._M_dataplus._M_p + 4) == ' ' &&
        *(int *)local_78.mCur._M_dataplus._M_p == 0x656e6f42)) {
      ReadChunkInfo_Ascii((COBImporter *)this_00,(ChunkInfo *)&stack0xffffffffffffffc0,&local_78);
      this_00 = (LineSplitter *)this;
      ReadBone_Ascii(this,out,&local_78,(ChunkInfo *)&stack0xffffffffffffffc0);
    }
    if ((4 < local_78.mCur._M_string_length) &&
       ((char)*(int *)(local_78.mCur._M_dataplus._M_p + 4) == ' ' &&
        *(int *)local_78.mCur._M_dataplus._M_p == 0x6e616843)) {
      ReadChunkInfo_Ascii((COBImporter *)this_00,(ChunkInfo *)&stack0xffffffffffffffc0,&local_78);
      if (8 < uStack_38) {
        UnsupportedChunk_Ascii
                  ((COBImporter *)this_00,&local_78,(ChunkInfo *)&stack0xffffffffffffffc0,"Chan");
      }
    }
    if ((4 < local_78.mCur._M_string_length) &&
       ((char)*(int *)(local_78.mCur._M_dataplus._M_p + 4) == ' ' &&
        *(int *)local_78.mCur._M_dataplus._M_p == 0x74696e55)) {
      ReadChunkInfo_Ascii((COBImporter *)this_00,(ChunkInfo *)&stack0xffffffffffffffc0,&local_78);
      ReadUnit_Ascii(this,out,&local_78,(ChunkInfo *)&stack0xffffffffffffffc0);
    }
    if ((3 < local_78.mCur._M_string_length) &&
       (*(int *)local_78.mCur._M_dataplus._M_p == 0x20444e45)) break;
    this_00 = &local_78;
    LineSplitter::operator++(&local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.mCur._M_dataplus._M_p != &local_78.mCur.field_2) {
    operator_delete(local_78.mCur._M_dataplus._M_p);
  }
  return;
}

Assistant:

void COBImporter::ReadAsciiFile(Scene& out, StreamReaderLE* stream)
{
    ChunkInfo ci;
    for(LineSplitter splitter(*stream);splitter;++splitter) {

        // add all chunks to be recognized here. /else ../ omitted intentionally.
        if (splitter.match_start("PolH ")) {
            ReadChunkInfo_Ascii(ci,splitter);
            ReadPolH_Ascii(out,splitter,ci);
        }
        if (splitter.match_start("BitM ")) {
            ReadChunkInfo_Ascii(ci,splitter);
            ReadBitM_Ascii(out,splitter,ci);
        }
        if (splitter.match_start("Mat1 ")) {
            ReadChunkInfo_Ascii(ci,splitter);
            ReadMat1_Ascii(out,splitter,ci);
        }
        if (splitter.match_start("Grou ")) {
            ReadChunkInfo_Ascii(ci,splitter);
            ReadGrou_Ascii(out,splitter,ci);
        }
        if (splitter.match_start("Lght ")) {
            ReadChunkInfo_Ascii(ci,splitter);
            ReadLght_Ascii(out,splitter,ci);
        }
        if (splitter.match_start("Came ")) {
            ReadChunkInfo_Ascii(ci,splitter);
            ReadCame_Ascii(out,splitter,ci);
        }
        if (splitter.match_start("Bone ")) {
            ReadChunkInfo_Ascii(ci,splitter);
            ReadBone_Ascii(out,splitter,ci);
        }
        if (splitter.match_start("Chan ")) {
            ReadChunkInfo_Ascii(ci,splitter);
            ReadChan_Ascii(out,splitter,ci);
        }
        if (splitter.match_start("Unit ")) {
            ReadChunkInfo_Ascii(ci,splitter);
            ReadUnit_Ascii(out,splitter,ci);
        }
        if (splitter.match_start("END ")) {
            // we don't need this, but I guess there is a reason this
            // chunk has been implemented into COB for.
            return;
        }
    }
}